

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

void __thiscall
absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
ResetAllocation(InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                *this,Allocation new_allocation,size_type new_size)

{
  ulong uVar1;
  undefined1 *__s;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  if ((uVar1 & 1) == 0) {
    if (uVar1 != 0) {
      memset(&this->rep_,0xab,(long)this + ((uVar1 >> 1) * 0x38 - (long)&this->rep_) + 8);
    }
    *(size_type *)&this->rep_ = new_allocation.capacity_;
  }
  else {
    __s = *(undefined1 **)((long)&this->rep_ + 8);
    if (1 < uVar1) {
      memset(__s,0xab,(uVar1 >> 1) * 0x38);
      __s = *(undefined1 **)((long)&this->rep_ + 8);
      if (&this->rep_ != (Rep *)__s && ((this->allocator_and_tag_).tag_.size_ & 1) == 0) {
        __assert_fail("begin() == allocated_space()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                      ,0x31b,
                      "void absl::InlinedVector<s2shapeutil::ShapeEdge, 16>::ResetAllocation(Allocation, size_type) [T = s2shapeutil::ShapeEdge, N = 16, A = std::allocator<s2shapeutil::ShapeEdge>]"
                     );
      }
    }
    operator_delete(__s);
    *(size_type *)&this->rep_ = new_allocation.capacity_;
  }
  *(pointer *)((long)&this->rep_ + 8) = new_allocation.buffer_;
  (this->allocator_and_tag_).tag_.size_ = new_size * 2 + 1;
  return;
}

Assistant:

void ResetAllocation(Allocation new_allocation, size_type new_size) {
    if (allocated()) {
      Destroy(allocated_space(), allocated_space() + size());
      assert(begin() == allocated_space());
      allocation().Dealloc(allocator());
      allocation() = new_allocation;
    } else {
      Destroy(inlined_space(), inlined_space() + size());
      init_allocation(new_allocation);  // bug: only init once
    }
    tag().set_allocated_size(new_size);
  }